

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmio.c
# Opt level: O0

mmio_file_t * mmio_file_read(char *filename)

{
  int __fd;
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  size_t pagesize;
  int fd;
  void *ptr;
  stat buf;
  mmio_file_t *mf;
  char *filename_local;
  
  __fd = open(filename,0);
  if (__fd == -1) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/mmio.c"
                   ,0xd9,"Failed to open %s",filename);
    filename_local = (char *)0x0;
  }
  else {
    iVar1 = fstat(__fd,(stat *)&ptr);
    if (iVar1 == -1) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/mmio.c"
                     ,0xdd,"Failed to stat %s",filename);
      close(__fd);
      filename_local = (char *)0x0;
    }
    else {
      pvVar2 = mmap((void *)0x0,buf.st_rdev,1,1,__fd,0);
      if (pvVar2 == (void *)0xffffffffffffffff) {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/mmio.c"
                       ,0xe3,"Failed to mmap %lld bytes",buf.st_rdev);
        close(__fd);
        filename_local = (char *)0x0;
      }
      else {
        close(__fd);
        buf.__glibc_reserved[2] =
             (__syscall_slong_t)
             __ckd_calloc__(1,0x10,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/mmio.c"
                            ,0xe8);
        *(void **)buf.__glibc_reserved[2] = pvVar2;
        uVar3 = sysconf(0x1e);
        *(ulong *)(buf.__glibc_reserved[2] + 8) = (((buf.st_rdev + uVar3) - 1) / uVar3) * uVar3;
        filename_local = (char *)buf.__glibc_reserved[2];
      }
    }
  }
  return (mmio_file_t *)filename_local;
}

Assistant:

mmio_file_t *
mmio_file_read(const char *filename)
{
    mmio_file_t *mf;
    struct stat buf;
    void *ptr;
    int fd;
    size_t pagesize;

    if ((fd = open(filename, O_RDONLY)) == -1) {
        E_ERROR_SYSTEM("Failed to open %s", filename);
        return NULL;
    }
    if (fstat(fd, &buf) == -1) {
        E_ERROR_SYSTEM("Failed to stat %s", filename);
        close(fd);
        return NULL;
    }
    ptr = mmap(NULL, buf.st_size, PROT_READ, MAP_SHARED, fd, 0);
    if (ptr == (void *)-1) {
        E_ERROR_SYSTEM("Failed to mmap %lld bytes", (unsigned long long)buf.st_size);
        close(fd);
        return NULL;
    }
    close(fd);
    mf = ckd_calloc(1, sizeof(*mf));
    mf->ptr = ptr;
    /* Align map size to next page. */
    pagesize = sysconf(_SC_PAGESIZE);
    mf->mapsize = (buf.st_size + pagesize - 1) / pagesize * pagesize;

    return mf;
}